

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O2

bool __thiscall
QXmlStreamReaderPrivate::referenceEntity
          (QXmlStreamReaderPrivate *this,QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *hash,
          Entity *entity)

{
  qsizetype qVar1;
  storage_type_conflict *psVar2;
  bool bVar3;
  int iVar4;
  QEntityReference *pQVar5;
  uint *puVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((entity->field_0x30 & 0x10) == 0) {
    qVar1 = (entity->name).d.size;
    iVar4 = ((int)(entity->value).d.size - (int)qVar1) + this->entityLength + -2;
    this->entityLength = iVar4;
    if (iVar4 <= this->entityExpansionLimit) {
      entity->field_0x30 = entity->field_0x30 | 0x10;
      psVar2 = (entity->name).d.ptr;
      pQVar5 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::QEntityReference>::push
                         (&this->entityReferenceStack);
      pQVar5->hash = hash;
      (pQVar5->name).m_size = qVar1;
      (pQVar5->name).m_data = psVar2;
      puVar6 = QXmlStreamSimpleStack<unsigned_int>::push(&this->putStack);
      *puVar6 = 0x2d0000;
      bVar3 = true;
      goto LAB_00359ee0;
    }
    QXmlStream::tr((QString *)&local_40,
                   "Entity expands to more characters than the entity expansion limit.",(char *)0x0,
                   -1);
    raiseWellFormedError(this,(QString *)&local_40);
  }
  else {
    QXmlStream::tr((QString *)&local_40,"Self-referencing entity detected.",(char *)0x0,-1);
    raiseWellFormedError(this,(QString *)&local_40);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  bVar3 = false;
LAB_00359ee0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

inline bool referenceEntity(QHash<QStringView, Entity> *hash, Entity &entity)
    {
        Q_ASSERT(hash);
        if (entity.isCurrentlyReferenced) {
            raiseWellFormedError(QXmlStream::tr("Self-referencing entity detected."));
            return false;
        }
        // entityLength represents the amount of additional characters the
        // entity expands into (can be negative for e.g. &amp;). It's used to
        // avoid DoS attacks through recursive entity expansions
        entityLength += entity.value.size() - entity.name.size() - 2;
        if (entityLength > entityExpansionLimit) {
            raiseWellFormedError(QXmlStream::tr("Entity expands to more characters than the entity expansion limit."));
            return false;
        }
        entity.isCurrentlyReferenced = true;
        entityReferenceStack.push() = { hash, entity.name };
        injectToken(ENTITY_DONE);
        return true;
    }